

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

string * __thiscall TCLAP::Arg::getDescription_abi_cxx11_(string *__return_storage_ptr__,Arg *this)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->_description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->_description)._M_string_length)
  ;
  if (this->_required == true) {
    std::operator+(&local_40," (",&this->_requireLabel);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
      local_60 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::getDescription() const
{
	std::string desc = _description;

	if(_required) {
		desc += " (" + _requireLabel + ")";
	}

	return desc;
}